

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int populate_languages_metadata(MMDB_s *mmdb,MMDB_s *metadata_db,MMDB_entry_s *metadata_start)

{
  uint uVar1;
  MMDB_entry_data_list_s *entry_data_list;
  char **ppcVar2;
  char *pcVar3;
  uint local_98;
  uint32_t i;
  uint32_t array_size;
  MMDB_entry_data_list_s *first_member;
  MMDB_entry_data_list_s *member;
  MMDB_entry_s array_start;
  char *pcStack_68;
  int status;
  char *path [2];
  MMDB_entry_data_s entry_data;
  MMDB_entry_s *metadata_start_local;
  MMDB_s *metadata_db_local;
  MMDB_s *mmdb_local;
  
  pcStack_68 = "languages";
  path[0] = (char *)0x0;
  array_start._12_4_ =
       MMDB_aget_value(metadata_start,(MMDB_entry_data_s *)(path + 1),&stack0xffffffffffffff98);
  mmdb_local._4_4_ = array_start._12_4_;
  if (array_start._12_4_ == 0) {
    if (entry_data.offset_to_next == 0xb) {
      member = (MMDB_entry_data_list_s *)metadata_db;
      array_start._12_4_ = MMDB_get_entry_data_list((MMDB_entry_s *)&member,&first_member);
      entry_data_list = first_member;
      mmdb_local._4_4_ = array_start._12_4_;
      if (array_start._12_4_ == 0) {
        uVar1 = (first_member->entry_data).data_size;
        (mmdb->metadata).languages.count = 0;
        ppcVar2 = (char **)calloc((ulong)uVar1,8);
        (mmdb->metadata).languages.names = ppcVar2;
        if ((mmdb->metadata).languages.names == (char **)0x0) {
          MMDB_free_entry_data_list(entry_data_list);
          mmdb_local._4_4_ = 5;
        }
        else {
          for (local_98 = 0; local_98 < uVar1; local_98 = local_98 + 1) {
            first_member = first_member->next;
            if ((first_member->entry_data).type != 2) {
              MMDB_free_entry_data_list(entry_data_list);
              return 3;
            }
            pcVar3 = mmdb_strndup((first_member->entry_data).field_1.utf8_string,
                                  (ulong)(first_member->entry_data).data_size);
            (mmdb->metadata).languages.names[local_98] = pcVar3;
            if ((mmdb->metadata).languages.names[local_98] == (char *)0x0) {
              MMDB_free_entry_data_list(entry_data_list);
              return 5;
            }
            (mmdb->metadata).languages.count = (ulong)(local_98 + 1);
          }
          MMDB_free_entry_data_list(entry_data_list);
          mmdb_local._4_4_ = 0;
        }
      }
    }
    else {
      mmdb_local._4_4_ = 3;
    }
  }
  return mmdb_local._4_4_;
}

Assistant:

static int populate_languages_metadata(MMDB_s *mmdb,
                                       MMDB_s *metadata_db,
                                       MMDB_entry_s *metadata_start) {
    MMDB_entry_data_s entry_data;

    const char *path[] = {"languages", NULL};
    int status = MMDB_aget_value(metadata_start, &entry_data, path);
    if (MMDB_SUCCESS != status) {
        return status;
    }
    if (MMDB_DATA_TYPE_ARRAY != entry_data.type) {
        return MMDB_INVALID_METADATA_ERROR;
    }

    MMDB_entry_s array_start = {.mmdb = metadata_db,
                                .offset = entry_data.offset};

    MMDB_entry_data_list_s *member;
    status = MMDB_get_entry_data_list(&array_start, &member);
    if (MMDB_SUCCESS != status) {
        return status;
    }

    MMDB_entry_data_list_s *first_member = member;

    uint32_t array_size = member->entry_data.data_size;
    MAYBE_CHECK_SIZE_OVERFLOW(
        array_size, SIZE_MAX / sizeof(char *), MMDB_INVALID_METADATA_ERROR);

    mmdb->metadata.languages.count = 0;
    mmdb->metadata.languages.names = calloc(array_size, sizeof(char *));
    if (NULL == mmdb->metadata.languages.names) {
        MMDB_free_entry_data_list(first_member);
        return MMDB_OUT_OF_MEMORY_ERROR;
    }

    for (uint32_t i = 0; i < array_size; i++) {
        member = member->next;
        if (MMDB_DATA_TYPE_UTF8_STRING != member->entry_data.type) {
            MMDB_free_entry_data_list(first_member);
            return MMDB_INVALID_METADATA_ERROR;
        }

        mmdb->metadata.languages.names[i] = mmdb_strndup(
            member->entry_data.utf8_string, member->entry_data.data_size);

        if (NULL == mmdb->metadata.languages.names[i]) {
            MMDB_free_entry_data_list(first_member);
            return MMDB_OUT_OF_MEMORY_ERROR;
        }
        // We assign this as we go so that if we fail a calloc and need to
        // free it, the count is right.
        mmdb->metadata.languages.count = i + 1;
    }

    MMDB_free_entry_data_list(first_member);

    return MMDB_SUCCESS;
}